

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O2

string_view mserialize::detail::resolve_recursive_tag(string_view full_tag,string_view intro)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  detail *pdVar5;
  char in_R8B;
  string_view sVar6;
  string_view s;
  string_view local_30;
  
  uVar2 = intro._len;
  s._ptr = (char *)full_tag._len;
  local_30._ptr = full_tag._ptr;
  if (uVar2 == 0) {
    sVar1 = 0;
    pdVar5 = (detail *)0x0;
  }
  else {
    pdVar5 = (detail *)0x0;
    do {
      if (s._ptr == (char *)0x0) {
LAB_00109337:
        sVar1 = 0;
        goto LAB_0010933f;
      }
      local_30._len = (size_t)s._ptr;
      s._ptr = (char *)string_view::find(&local_30,intro,0);
      if (local_30._len < s._ptr) {
        s._ptr = (char *)local_30._len;
      }
      uVar3 = local_30._len - (long)s._ptr;
      uVar4 = uVar2;
      if (uVar3 < uVar2) {
        uVar4 = uVar3;
      }
      local_30._ptr = s._ptr + (long)local_30._ptr + uVar4;
      s._ptr = (char *)(uVar3 - uVar4);
      if ((uVar3 <= uVar2) || ((detail)*local_30._ptr == (detail)0x7d)) goto LAB_00109337;
    } while ((detail)*local_30._ptr != (detail)0x60);
    s._len = 0x7b;
    local_30._len = (size_t)s._ptr;
    sVar1 = size_between_balanced((detail *)local_30._ptr,s,'}',in_R8B);
    sVar1 = sVar1 - 1;
    pdVar5 = (detail *)local_30._ptr;
  }
LAB_0010933f:
  sVar6._len = sVar1;
  sVar6._ptr = (char *)pdVar5;
  return sVar6;
}

Assistant:

inline string_view resolve_recursive_tag(string_view full_tag, string_view intro)
{
  if (intro.empty()) { return {}; }

  while (! full_tag.empty())
  {
    const std::size_t intro_pos = full_tag.find(intro);
    full_tag.remove_prefix(intro_pos);
    full_tag.remove_prefix(intro.size());
    if (full_tag.empty()) { break; }
    if (full_tag.front() == '}') { break; } // empty struct
    if (full_tag.front() == '`') // definition found
    {
      const std::size_t size = size_between_balanced(full_tag, '{', '}');
      return string_view{full_tag.data(), size - 1};
    }
    // else: spurious find, e.g: found {FooBar for {Foo
  }

  return {};
}